

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_stats.c
# Opt level: O0

void cram_stats_dump(cram_stats *st)

{
  uint local_18;
  uint local_14;
  khint_t k;
  int i;
  cram_stats *st_local;
  
  fprintf(_stderr,"cram_stats:\n");
  for (local_14 = 0; (int)local_14 < 0x400; local_14 = local_14 + 1) {
    if (st->freqs[(int)local_14] != 0) {
      fprintf(_stderr,"\t%d\t%d\n",(ulong)local_14,(ulong)(uint)st->freqs[(int)local_14]);
    }
  }
  if (st->h != (kh_m_i2i_t *)0x0) {
    for (local_18 = 0; local_18 != st->h->n_buckets; local_18 = local_18 + 1) {
      if ((st->h->flags[local_18 >> 4] >> (sbyte)((local_18 & 0xf) << 1) & 3) == 0) {
        fprintf(_stderr,"\t%d\t%d\n",(ulong)st->h->keys[local_18],(ulong)(uint)st->h->vals[local_18]
               );
      }
    }
  }
  return;
}

Assistant:

void cram_stats_dump(cram_stats *st) {
    int i;
    fprintf(stderr, "cram_stats:\n");
    for (i = 0; i < MAX_STAT_VAL; i++) {
	if (!st->freqs[i])
	    continue;
	fprintf(stderr, "\t%d\t%d\n", i, st->freqs[i]);
    }
    if (st->h) {
	khint_t k;
	for (k = kh_begin(st->h); k != kh_end(st->h); k++) {
	    if (!kh_exist(st->h, k))
		continue;

	    fprintf(stderr, "\t%d\t%d\n", kh_key(st->h, k), kh_val(st->h, k));
	}
    }
}